

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getIterate(Highs *this)

{
  Highs *in_RDI;
  HighsLp *in_stack_00000020;
  HEkk *in_stack_00000028;
  HighsStatus call_status;
  HighsBasis *in_stack_ffffffffffffff78;
  HEkk *in_stack_ffffffffffffff88;
  HighsStatus in_stack_ffffffffffffffcc;
  Highs *in_stack_ffffffffffffffd0;
  HighsStatus local_4;
  
  if (((in_RDI->ekk_instance_).status_.initialised_for_new_lp & 1U) == 0) {
    highsLogUser(&(in_RDI->options_).super_HighsOptionsStruct.log_options,kError,
                 "getIterate: no simplex iterate to get\n");
    local_4 = kError;
  }
  else {
    local_4 = HEkk::getIterate(in_stack_ffffffffffffff88);
    if (local_4 == kOk) {
      HEkk::getHighsBasis(in_stack_00000028,in_stack_00000020);
      HighsBasis::operator=((HighsBasis *)in_RDI,in_stack_ffffffffffffff78);
      HighsBasis::~HighsBasis((HighsBasis *)in_RDI);
      invalidateModelStatusSolutionAndInfo(in_RDI);
      local_4 = returnFromHighs(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getIterate() {
  // Check that there is a simplex iterate to get
  if (!ekk_instance_.status_.initialised_for_new_lp) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getIterate: no simplex iterate to get\n");
    return HighsStatus::kError;
  }
  HighsStatus call_status = ekk_instance_.getIterate();
  if (call_status != HighsStatus::kOk) return call_status;
  // Get the corresponding HiGHS basis
  basis_ = ekk_instance_.getHighsBasis(model_.lp_);
  // Clear everything else
  invalidateModelStatusSolutionAndInfo();
  return returnFromHighs(HighsStatus::kOk);
}